

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS ref_interp_from_part(REF_INTERP ref_interp,REF_INT *to_part)

{
  uint uVar1;
  REF_DBL local_238;
  REF_GLOB local_230;
  REF_STATUS ref_private_macro_code_rss_32;
  REF_STATUS ref_private_macro_code_rss_31;
  REF_STATUS ref_private_macro_code_rss_30;
  REF_STATUS ref_private_macro_code_rss_29;
  REF_STATUS ref_private_macro_code_rss_28;
  REF_STATUS ref_private_macro_code_rss_27;
  REF_STATUS ref_private_macro_code_rss_26;
  REF_STATUS ref_private_macro_code_rss_25;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_INT ref_malloc_init_i_1;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL report_interp_error;
  REF_BOOL report_migration_volume;
  REF_DBL max_error;
  REF_INT *lookedup_cell;
  REF_INT *lookedup_donation;
  REF_GLOB *find_nodes;
  REF_INT *find_cell;
  REF_INT *find_donation;
  REF_INT *find_ret;
  REF_DBL *donor_bary;
  REF_DBL *recept_bary;
  REF_GLOB *donor_nodes;
  REF_GLOB *donor_global;
  REF_GLOB *recept_global;
  REF_INT *recept_cell;
  REF_INT *recept_ret;
  REF_INT *recept_part;
  REF_INT *donor_origpart;
  REF_INT *donor_part;
  REF_INT *donor_donation;
  REF_INT *donor_cell;
  REF_INT *donor_ret;
  REF_INT n_lookedup;
  REF_INT lookedup;
  REF_INT n_find;
  REF_INT find;
  REF_INT n_donor;
  REF_INT donation;
  REF_INT n_recept;
  REF_INT recept;
  REF_INT *from_part;
  REF_INT nodes [27];
  REF_INT cell_node;
  REF_INT i;
  REF_INT node;
  REF_CELL from_cell;
  REF_NODE from_node;
  REF_NODE to_node;
  REF_GRID from_grid;
  REF_GRID to_grid;
  REF_MPI ref_mpi;
  REF_INT *to_part_local;
  REF_INTERP ref_interp_local;
  
  to_grid = (REF_GRID)ref_interp->ref_mpi;
  from_grid = ref_interp->to_grid;
  to_node = (REF_NODE)ref_interp->from_grid;
  from_node = from_grid->node;
  from_cell = (REF_CELL)((REF_GRID)to_node)->node;
  if (((REF_GRID)to_node)->twod == 0) {
    _i = ref_interp->from_tet;
  }
  else {
    _i = ref_interp->from_tri;
  }
  ref_mpi = (REF_MPI)to_part;
  to_part_local = (REF_INT *)ref_interp;
  if ((ref_interp->max < from_node->max) &&
     (uVar1 = ref_interp_resize(ref_interp,from_node->max), uVar1 != 0)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0xad3,
           "ref_interp_from_part",(ulong)uVar1,"resize");
    ref_interp_local._4_4_ = uVar1;
  }
  else if (from_cell->last_node_is_an_id < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0xad6,
           "ref_interp_from_part","malloc from_part of REF_INT negative");
    ref_interp_local._4_4_ = 1;
  }
  else {
    _n_recept = (REF_INT *)malloc((long)from_cell->last_node_is_an_id << 2);
    if (_n_recept == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0xad6,"ref_interp_from_part","malloc from_part of REF_INT NULL");
      ref_interp_local._4_4_ = 2;
    }
    else {
      for (ref_private_macro_code_rss_3 = 0;
          ref_private_macro_code_rss_3 < from_cell->last_node_is_an_id;
          ref_private_macro_code_rss_3 = ref_private_macro_code_rss_3 + 1) {
        _n_recept[ref_private_macro_code_rss_3] = -1;
      }
      n_donor = 0;
      for (cell_node = 0; cell_node < from_node->max; cell_node = cell_node + 1) {
        if ((((-1 < cell_node) && (cell_node < from_node->max)) &&
            (-1 < from_node->global[cell_node])) &&
           ((from_node->ref_mpi->id == from_node->part[cell_node] &&
            (*(int *)(*(long *)(to_part_local + 0x18) + (long)cell_node * 4) != -1)))) {
          n_donor = n_donor + 1;
        }
      }
      if (n_donor * 4 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0xadf,"ref_interp_from_part","malloc recept_bary of REF_DBL negative");
        ref_interp_local._4_4_ = 1;
      }
      else {
        donor_bary = (REF_DBL *)malloc((long)(n_donor << 2) << 3);
        if (donor_bary == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0xadf,"ref_interp_from_part","malloc recept_bary of REF_DBL NULL");
          ref_interp_local._4_4_ = 2;
        }
        else if (n_donor < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0xae0,"ref_interp_from_part","malloc recept_cell of REF_INT negative");
          ref_interp_local._4_4_ = 1;
        }
        else {
          recept_global = (REF_GLOB *)malloc((long)n_donor << 2);
          if (recept_global == (REF_GLOB *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0xae0,"ref_interp_from_part","malloc recept_cell of REF_INT NULL");
            ref_interp_local._4_4_ = 2;
          }
          else if (n_donor < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0xae1,"ref_interp_from_part","malloc recept_global of REF_GLOB negative");
            ref_interp_local._4_4_ = 1;
          }
          else {
            donor_global = (REF_GLOB *)malloc((long)n_donor << 3);
            if (donor_global == (REF_GLOB *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0xae1,"ref_interp_from_part","malloc recept_global of REF_GLOB NULL");
              ref_interp_local._4_4_ = 2;
            }
            else if (n_donor < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0xae2,"ref_interp_from_part","malloc recept_ret of REF_INT negative");
              ref_interp_local._4_4_ = 1;
            }
            else {
              recept_cell = (REF_INT *)malloc((long)n_donor << 2);
              if (recept_cell == (REF_INT *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0xae2,"ref_interp_from_part","malloc recept_ret of REF_INT NULL");
                ref_interp_local._4_4_ = 2;
              }
              else if (n_donor < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0xae3,"ref_interp_from_part","malloc recept_part of REF_INT negative");
                ref_interp_local._4_4_ = 1;
              }
              else {
                recept_ret = (REF_INT *)malloc((long)n_donor << 2);
                if (recept_ret == (REF_INT *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                         ,0xae3,"ref_interp_from_part","malloc recept_part of REF_INT NULL");
                  ref_interp_local._4_4_ = 2;
                }
                else {
                  n_donor = 0;
                  for (cell_node = 0; cell_node < from_node->max; cell_node = cell_node + 1) {
                    if (((-1 < cell_node) && (cell_node < from_node->max)) &&
                       ((-1 < from_node->global[cell_node] &&
                        ((from_node->ref_mpi->id == from_node->part[cell_node] &&
                         (*(int *)(*(long *)(to_part_local + 0x18) + (long)cell_node * 4) != -1)))))
                       ) {
                      for (nodes[0x1a] = 0; nodes[0x1a] < 4; nodes[0x1a] = nodes[0x1a] + 1) {
                        donor_bary[nodes[0x1a] + n_donor * 4] =
                             *(REF_DBL *)
                              (*(long *)(to_part_local + 0x1c) +
                              (long)(nodes[0x1a] + cell_node * 4) * 8);
                      }
                      *(undefined4 *)((long)recept_global + (long)n_donor * 4) =
                           *(undefined4 *)(*(long *)(to_part_local + 0x18) + (long)cell_node * 4);
                      if (((cell_node < 0) || (from_node->max <= cell_node)) ||
                         (from_node->global[cell_node] < 0)) {
                        local_230 = -1;
                      }
                      else {
                        local_230 = from_node->global[cell_node];
                      }
                      donor_global[n_donor] = local_230;
                      recept_ret[n_donor] =
                           *(REF_INT *)(*(long *)(to_part_local + 0x1a) + (long)cell_node * 4);
                      recept_cell[n_donor] = (&ref_mpi->n)[cell_node];
                      n_donor = n_donor + 1;
                    }
                  }
                  uVar1 = ref_mpi_blindsend((REF_MPI)to_grid,recept_ret,recept_global,1,n_donor,
                                            &donor_donation,&n_find,1);
                  if (uVar1 == 0) {
                    uVar1 = ref_mpi_blindsend((REF_MPI)to_grid,recept_ret,recept_cell,1,n_donor,
                                              &donor_cell,&n_find,1);
                    if (uVar1 == 0) {
                      uVar1 = ref_mpi_blindsend((REF_MPI)to_grid,recept_ret,donor_global,1,n_donor,
                                                &donor_nodes,&n_find,2);
                      if (uVar1 == 0) {
                        uVar1 = ref_mpi_blindsend((REF_MPI)to_grid,recept_ret,donor_bary,4,n_donor,
                                                  &find_ret,&n_find,3);
                        if (uVar1 == 0) {
                          if (n_find * 4 < 0) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                   ,0xb01,"ref_interp_from_part",
                                   "malloc donor_nodes of REF_GLOB negative");
                            ref_interp_local._4_4_ = 1;
                          }
                          else {
                            recept_bary = (REF_DBL *)malloc((long)(n_find << 2) << 3);
                            if (recept_bary == (REF_DBL *)0x0) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                     ,0xb01,"ref_interp_from_part",
                                     "malloc donor_nodes of REF_GLOB NULL");
                              ref_interp_local._4_4_ = 2;
                            }
                            else {
                              for (ref_private_macro_code_rss_7 = 0;
                                  ref_private_macro_code_rss_7 < n_find * 4;
                                  ref_private_macro_code_rss_7 = ref_private_macro_code_rss_7 + 1) {
                                recept_bary[ref_private_macro_code_rss_7] = -NAN;
                              }
                              if (n_find < 0) {
                                printf("%s: %d: %s: %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                       ,0xb02,"ref_interp_from_part",
                                       "malloc donor_donation of REF_INT negative");
                                ref_interp_local._4_4_ = 1;
                              }
                              else {
                                donor_part = (REF_INT *)malloc((long)n_find << 2);
                                if (donor_part == (REF_INT *)0x0) {
                                  printf("%s: %d: %s: %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                         ,0xb02,"ref_interp_from_part",
                                         "malloc donor_donation of REF_INT NULL");
                                  ref_interp_local._4_4_ = 2;
                                }
                                else if (n_find < 0) {
                                  printf("%s: %d: %s: %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                         ,0xb03,"ref_interp_from_part",
                                         "malloc donor_part of REF_INT negative");
                                  ref_interp_local._4_4_ = 1;
                                }
                                else {
                                  donor_origpart = (REF_INT *)malloc((long)n_find << 2);
                                  if (donor_origpart == (REF_INT *)0x0) {
                                    printf("%s: %d: %s: %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                           ,0xb03,"ref_interp_from_part",
                                           "malloc donor_part of REF_INT NULL");
                                    ref_interp_local._4_4_ = 2;
                                  }
                                  else if (n_find < 0) {
                                    printf("%s: %d: %s: %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                           ,0xb04,"ref_interp_from_part",
                                           "malloc donor_origpart of REF_INT negative");
                                    ref_interp_local._4_4_ = 1;
                                  }
                                  else {
                                    recept_part = (REF_INT *)malloc((long)n_find << 2);
                                    if (recept_part == (REF_INT *)0x0) {
                                      printf("%s: %d: %s: %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                             ,0xb04,"ref_interp_from_part",
                                             "malloc donor_origpart of REF_INT NULL");
                                      ref_interp_local._4_4_ = 2;
                                    }
                                    else {
                                      for (find = 0; find < n_find; find = find + 1) {
                                        uVar1 = ref_cell_nodes(_i,donor_donation[find],
                                                               (REF_INT *)&from_part);
                                        if (uVar1 != 0) {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                 ,0xb08,"ref_interp_from_part",(ulong)uVar1,
                                                 "node needs to be localized");
                                          return uVar1;
                                        }
                                        for (nodes[0x1a] = 0; nodes[0x1a] < _i->node_per;
                                            nodes[0x1a] = nodes[0x1a] + 1) {
                                          _n_recept[nodes[(long)nodes[0x1a] + -2]] =
                                               donor_cell[find];
                                        }
                                      }
                                      uVar1 = ref_node_ghost_int((REF_NODE)from_cell,_n_recept,1);
                                      if (uVar1 == 0) {
                                        uVar1 = ref_interp_fill_empty_from_part
                                                          ((REF_INTERP)to_part_local,_n_recept);
                                        if (uVar1 == 0) {
                                          for (find = 0; find < n_find; find = find + 1) {
                                            uVar1 = ref_cell_nodes(_i,donor_donation[find],
                                                                   (REF_INT *)&from_part);
                                            if (uVar1 != 0) {
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0xb16,"ref_interp_from_part",(ulong)uVar1,
                                                  "node needs to be localized");
                                              return uVar1;
                                            }
                                            for (nodes[0x1a] = 0; nodes[0x1a] < _i->node_per;
                                                nodes[0x1a] = nodes[0x1a] + 1) {
                                              if (((nodes[(long)nodes[0x1a] + -2] < 0) ||
                                                  (from_cell->last_node_is_an_id <=
                                                   nodes[(long)nodes[0x1a] + -2])) ||
                                                 (*(long *)(*(long *)&from_cell->edge_per +
                                                           (long)nodes[(long)nodes[0x1a] + -2] * 8)
                                                  < 0)) {
                                                local_238 = -NAN;
                                              }
                                              else {
                                                local_238 = *(REF_DBL *)
                                                             (*(long *)&from_cell->edge_per +
                                                             (long)nodes[(long)nodes[0x1a] + -2] * 8
                                                             );
                                              }
                                              recept_bary[nodes[0x1a] + find * 4] = local_238;
                                            }
                                            donor_part[find] = find;
                                            uVar1 = ref_cell_part_cell_node
                                                              (_i,(REF_NODE)from_cell,
                                                               donor_donation[find],nodes + 0x19);
                                            if (uVar1 != 0) {
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0xb1d,"ref_interp_from_part",(ulong)uVar1,
                                                  "part cell_node");
                                              return uVar1;
                                            }
                                            donor_origpart[find] =
                                                 _n_recept[nodes[(long)nodes[0x19] + -2]];
                                            recept_part[find] =
                                                 *(REF_INT *)((long)&to_grid->mpi + 4);
                                          }
                                          for (cell_node = 0;
                                              cell_node < from_cell->last_node_is_an_id;
                                              cell_node = cell_node + 1) {
                                            if (((-1 < cell_node) &&
                                                (cell_node < from_cell->last_node_is_an_id)) &&
                                               ((-1 < *(long *)(*(long *)&from_cell->edge_per +
                                                               (long)cell_node * 8) &&
                                                (_n_recept[cell_node] == -1)))) {
                                              printf("%s: %d: %s: %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0xb24,"ref_interp_from_part",
                                                  "from_part not set for node");
                                              return 1;
                                            }
                                          }
                                          for (cell_node = 0;
                                              cell_node < from_cell->last_node_is_an_id;
                                              cell_node = cell_node + 1) {
                                            *(REF_INT *)
                                             (*(long *)&from_cell->n + (long)cell_node * 4) =
                                                 _n_recept[cell_node];
                                          }
                                          uVar1 = ref_migrate_shufflin((REF_GRID)to_node);
                                          if (uVar1 == 0) {
                                            if (to_part_local[8] != 0) {
                                              ref_cell_free(*(REF_CELL *)(to_part_local + 6));
                                              ref_cell_free(*(REF_CELL *)(to_part_local + 4));
                                              uVar1 = ref_shard_extract_tri
                                                                ((REF_GRID)to_node,
                                                                 (REF_CELL *)(to_part_local + 6));
                                              if (uVar1 != 0) {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0xb32,"ref_interp_from_part",(ulong)uVar1,
                                                  "shard tri");
                                                return uVar1;
                                              }
                                              uVar1 = ref_shard_extract_tet
                                                                ((REF_GRID)to_node,
                                                                 (REF_CELL *)(to_part_local + 4));
                                              if (uVar1 != 0) {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0xb34,"ref_interp_from_part",(ulong)uVar1,
                                                  "shard tet");
                                                return uVar1;
                                              }
                                              if ((int)to_node[1].old_n_global == 0) {
                                                _i = *(REF_CELL *)(to_part_local + 4);
                                              }
                                              else {
                                                _i = *(REF_CELL *)(to_part_local + 6);
                                              }
                                            }
                                            uVar1 = ref_mpi_blindsend((REF_MPI)to_grid,
                                                                      donor_origpart,recept_bary,4,
                                                                      n_find,&lookedup_donation,
                                                                      &n_lookedup,2);
                                            if (uVar1 == 0) {
                                              uVar1 = ref_mpi_blindsend((REF_MPI)to_grid,
                                                                        donor_origpart,donor_part,1,
                                                                        n_find,&find_cell,
                                                                        &n_lookedup,1);
                                              if (uVar1 == 0) {
                                                uVar1 = ref_mpi_blindsend((REF_MPI)to_grid,
                                                                          donor_origpart,recept_part
                                                                          ,1,n_find,&find_donation,
                                                                          &n_lookedup,1);
                                                if (uVar1 == 0) {
                                                  if (n_lookedup < 0) {
                                                    printf("%s: %d: %s: %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0xb48,"ref_interp_from_part",
                                                  "malloc find_cell of REF_INT negative");
                                                  ref_interp_local._4_4_ = 1;
                                                  }
                                                  else {
                                                    find_nodes = (REF_GLOB *)
                                                                 malloc((long)n_lookedup << 2);
                                                    if (find_nodes == (REF_GLOB *)0x0) {
                                                      printf("%s: %d: %s: %s\n",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0xb48,"ref_interp_from_part",
                                                  "malloc find_cell of REF_INT NULL");
                                                  ref_interp_local._4_4_ = 2;
                                                  }
                                                  else {
                                                    for (lookedup = 0; lookedup < n_lookedup;
                                                        lookedup = lookedup + 1) {
                                                      for (nodes[0x1a] = 0;
                                                          nodes[0x1a] < _i->node_per;
                                                          nodes[0x1a] = nodes[0x1a] + 1) {
                                                        uVar1 = ref_node_local((REF_NODE)from_cell,
                                                                               *(REF_GLOB *)
                                                                                (lookedup_donation +
                                                                                (long)(nodes[0x1a] +
                                                                                      lookedup * 4)
                                                                                * 2),nodes + (long)
                                                  nodes[0x1a] + -2);
                                                  if (uVar1 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0xb4d,"ref_interp_from_part",(ulong)uVar1,"g2l");
                                                  return uVar1;
                                                  }
                                                  }
                                                  uVar1 = ref_cell_with(_i,(REF_INT *)&from_part,
                                                                        (REF_INT *)
                                                                        ((long)find_nodes +
                                                                        (long)lookedup * 4));
                                                  if (uVar1 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0xb50,"ref_interp_from_part",(ulong)uVar1,
                                                  "find cell with nodes");
                                                  return uVar1;
                                                  }
                                                  }
                                                  uVar1 = ref_mpi_blindsend((REF_MPI)to_grid,
                                                                            find_donation,find_nodes
                                                                            ,1,n_lookedup,
                                                                            (void **)&max_error,
                                                                            (REF_INT *)&donor_ret,1)
                                                  ;
                                                  if (uVar1 == 0) {
                                                    uVar1 = ref_mpi_blindsend((REF_MPI)to_grid,
                                                                              find_donation,
                                                                              find_cell,1,n_lookedup
                                                                              ,&lookedup_cell,
                                                                              (REF_INT *)&donor_ret,
                                                                              1);
                                                    if (uVar1 == 0) {
                                                      for (donor_ret._4_4_ = 0;
                                                          donor_ret._4_4_ < (int)donor_ret;
                                                          donor_ret._4_4_ = donor_ret._4_4_ + 1) {
                                                        donor_donation
                                                        [lookedup_cell[donor_ret._4_4_]] =
                                                             *(REF_INT *)
                                                              ((long)max_error +
                                                              (long)donor_ret._4_4_ * 4);
                                                      }
                                                      for (cell_node = 0; cell_node < from_node->max
                                                          ; cell_node = cell_node + 1) {
                                                        from_node->part[cell_node] =
                                                             (&ref_mpi->n)[cell_node];
                                                      }
                                                      uVar1 = ref_migrate_shufflin(from_grid);
                                                      if (uVar1 == 0) {
                                                        uVar1 = ref_interp_reset((REF_INTERP)
                                                                                 to_part_local);
                                                        if (uVar1 == 0) {
                                                          if (recept_ret != (REF_INT *)0x0) {
                                                            free(recept_ret);
                                                          }
                                                          if (donor_global != (REF_GLOB *)0x0) {
                                                            free(donor_global);
                                                          }
                                                          if (recept_global != (REF_GLOB *)0x0) {
                                                            free(recept_global);
                                                          }
                                                          if (donor_bary != (REF_DBL *)0x0) {
                                                            free(donor_bary);
                                                          }
                                                          uVar1 = ref_mpi_blindsend((REF_MPI)to_grid
                                                                                    ,donor_cell,
                                                                                    donor_donation,1
                                                                                    ,n_find,&
                                                  recept_global,&n_donor,1);
                                                  if (uVar1 == 0) {
                                                    uVar1 = ref_mpi_blindsend((REF_MPI)to_grid,
                                                                              donor_cell,donor_nodes
                                                                              ,1,n_find,
                                                                              &donor_global,&n_donor
                                                                              ,2);
                                                    if (uVar1 == 0) {
                                                      uVar1 = ref_mpi_blindsend((REF_MPI)to_grid,
                                                                                donor_cell,
                                                                                donor_origpart,1,
                                                                                n_find,&recept_ret,
                                                                                &n_donor,1);
                                                      if (uVar1 == 0) {
                                                        uVar1 = ref_mpi_blindsend((REF_MPI)to_grid,
                                                                                  donor_cell,
                                                                                  find_ret,4,n_find,
                                                                                  &donor_bary,
                                                                                  &n_donor,3);
                                                        if (uVar1 == 0) {
                                                          for (donation = 0; donation < n_donor;
                                                              donation = donation + 1) {
                                                            uVar1 = ref_node_local(from_node,
                                                                                   donor_global
                                                                                   [donation],
                                                                                   &cell_node);
                                                            if (uVar1 != 0) {
                                                              printf("%s: %d: %s: %d %s\n",
                                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0xb7c,"ref_interp_from_part",(ulong)uVar1,"g2l");
                                                  return uVar1;
                                                  }
                                                  *(undefined4 *)
                                                   (*(long *)(to_part_local + 0x18) +
                                                   (long)cell_node * 4) =
                                                       *(undefined4 *)
                                                        ((long)recept_global + (long)donation * 4);
                                                  *(REF_INT *)
                                                   (*(long *)(to_part_local + 0x1a) +
                                                   (long)cell_node * 4) = recept_ret[donation];
                                                  for (nodes[0x1a] = 0; nodes[0x1a] < 4;
                                                      nodes[0x1a] = nodes[0x1a] + 1) {
                                                    *(REF_DBL *)
                                                     (*(long *)(to_part_local + 0x1c) +
                                                     (long)(nodes[0x1a] + cell_node * 4) * 8) =
                                                         donor_bary[nodes[0x1a] + donation * 4];
                                                  }
                                                  }
                                                  uVar1 = ref_search_free(*(REF_SEARCH *)
                                                                           (to_part_local + 0x2a));
                                                  if (uVar1 == 0) {
                                                    uVar1 = ref_interp_create_search
                                                                      ((REF_INTERP)to_part_local);
                                                    if (uVar1 == 0) {
                                                      if (lookedup_cell != (REF_INT *)0x0) {
                                                        free(lookedup_cell);
                                                      }
                                                      if (max_error != 0.0) {
                                                        free((void *)max_error);
                                                      }
                                                      if (find_nodes != (REF_GLOB *)0x0) {
                                                        free(find_nodes);
                                                      }
                                                      if (find_donation != (REF_INT *)0x0) {
                                                        free(find_donation);
                                                      }
                                                      if (find_cell != (REF_INT *)0x0) {
                                                        free(find_cell);
                                                      }
                                                      if (lookedup_donation != (REF_INT *)0x0) {
                                                        free(lookedup_donation);
                                                      }
                                                      if (recept_part != (REF_INT *)0x0) {
                                                        free(recept_part);
                                                      }
                                                      if (donor_origpart != (REF_INT *)0x0) {
                                                        free(donor_origpart);
                                                      }
                                                      if (donor_part != (REF_INT *)0x0) {
                                                        free(donor_part);
                                                      }
                                                      if (recept_bary != (REF_DBL *)0x0) {
                                                        free(recept_bary);
                                                      }
                                                      if (find_ret != (REF_INT *)0x0) {
                                                        free(find_ret);
                                                      }
                                                      if (donor_nodes != (REF_GLOB *)0x0) {
                                                        free(donor_nodes);
                                                      }
                                                      if (donor_cell != (REF_INT *)0x0) {
                                                        free(donor_cell);
                                                      }
                                                      if (donor_donation != (REF_INT *)0x0) {
                                                        free(donor_donation);
                                                      }
                                                      if (recept_ret != (REF_INT *)0x0) {
                                                        free(recept_ret);
                                                      }
                                                      if (recept_cell != (REF_INT *)0x0) {
                                                        free(recept_cell);
                                                      }
                                                      if (donor_global != (REF_GLOB *)0x0) {
                                                        free(donor_global);
                                                      }
                                                      if (recept_global != (REF_GLOB *)0x0) {
                                                        free(recept_global);
                                                      }
                                                      if (donor_bary != (REF_DBL *)0x0) {
                                                        free(donor_bary);
                                                      }
                                                      if (_n_recept != (REF_INT *)0x0) {
                                                        free(_n_recept);
                                                      }
                                                      ref_interp_local._4_4_ = 0;
                                                    }
                                                    else {
                                                      printf("%s: %d: %s: %d %s\n",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0xb86,"ref_interp_from_part",(ulong)uVar1,
                                                  "(re)build search tree");
                                                  ref_interp_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0xb85,"ref_interp_from_part",(ulong)uVar1,
                                                  "free search tree");
                                                  ref_interp_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0xb79,"ref_interp_from_part",(ulong)uVar1,
                                                  "blind send cell");
                                                  ref_interp_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0xb76,"ref_interp_from_part",(ulong)uVar1,
                                                  "blind send cell");
                                                  ref_interp_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0xb73,"ref_interp_from_part",(ulong)uVar1,
                                                  "blind send cell");
                                                  ref_interp_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0xb70,"ref_interp_from_part",(ulong)uVar1,
                                                  "blind send cell");
                                                  ref_interp_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0xb67,"ref_interp_from_part",(ulong)uVar1,
                                                  "ref_interp resize/reset");
                                                  ref_interp_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0xb64,"ref_interp_from_part",(ulong)uVar1,
                                                  "shufflin to grid");
                                                  ref_interp_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0xb59,"ref_interp_from_part",(ulong)uVar1,
                                                  "blind send cell");
                                                  ref_interp_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0xb55,"ref_interp_from_part",(ulong)uVar1,
                                                  "blind send cell");
                                                  ref_interp_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  }
                                                }
                                                else {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0xb46,"ref_interp_from_part",(ulong)uVar1,
                                                  "blind send cell");
                                                  ref_interp_local._4_4_ = uVar1;
                                                }
                                              }
                                              else {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0xb43,"ref_interp_from_part",(ulong)uVar1,
                                                  "blind send cell");
                                                ref_interp_local._4_4_ = uVar1;
                                              }
                                            }
                                            else {
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0xb40,"ref_interp_from_part",(ulong)uVar1,
                                                  "blind send cell");
                                              ref_interp_local._4_4_ = uVar1;
                                            }
                                          }
                                          else {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0xb2c,"ref_interp_from_part",(ulong)uVar1,
                                                  "shufflin from grid");
                                            ref_interp_local._4_4_ = uVar1;
                                          }
                                        }
                                        else {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                 ,0xb10,"ref_interp_from_part",(ulong)uVar1,
                                                 "fill part");
                                          ref_interp_local._4_4_ = uVar1;
                                        }
                                      }
                                      else {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                               ,0xb0d,"ref_interp_from_part",(ulong)uVar1,
                                               "ghost from_part");
                                        ref_interp_local._4_4_ = uVar1;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0xaff,"ref_interp_from_part",(ulong)uVar1,"blind send bary");
                          ref_interp_local._4_4_ = uVar1;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                               ,0xafc,"ref_interp_from_part",(ulong)uVar1,"blind send global");
                        ref_interp_local._4_4_ = uVar1;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0xaf8,"ref_interp_from_part",(ulong)uVar1,"blind send ret");
                      ref_interp_local._4_4_ = uVar1;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0xaf5,"ref_interp_from_part",(ulong)uVar1,"blind send cell");
                    ref_interp_local._4_4_ = uVar1;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return ref_interp_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_interp_from_part(REF_INTERP ref_interp,
                                        REF_INT *to_part) {
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_NODE from_node = ref_grid_node(from_grid);
  REF_CELL from_cell;
  REF_INT node, i, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT *from_part;
  REF_INT recept, n_recept, donation, n_donor;
  REF_INT find, n_find, lookedup, n_lookedup;
  REF_INT *donor_ret, *donor_cell, *donor_donation, *donor_part,
      *donor_origpart;
  REF_INT *recept_part, *recept_ret, *recept_cell;
  REF_GLOB *recept_global, *donor_global, *donor_nodes;
  REF_DBL *recept_bary, *donor_bary;
  REF_INT *find_ret, *find_donation, *find_cell;
  REF_GLOB *find_nodes;
  REF_INT *lookedup_donation, *lookedup_cell;
  REF_DBL max_error = -1.0;
  REF_BOOL report_migration_volume = REF_FALSE;
  REF_BOOL report_interp_error = REF_FALSE;

  if (ref_grid_twod(from_grid)) {
    from_cell = ref_interp_from_tri(ref_interp);
  } else {
    from_cell = ref_interp_from_tet(ref_interp);
  }

  if (report_interp_error) {
    RSS(ref_interp_max_error(ref_interp, &max_error), "max error");
    if (ref_mpi_once(ref_grid_mpi(to_grid))) {
      printf("starting %e max error\n", max_error);
    }
  }

  if (ref_node_max(to_node) > ref_interp_max(ref_interp)) {
    RSS(ref_interp_resize(ref_interp, ref_node_max(to_node)), "resize");
  }

  ref_malloc_init(from_part, ref_node_max(from_node), REF_INT, REF_EMPTY);

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node) && REF_EMPTY != ref_interp->cell[node]) {
      n_recept++;
    }
  }

  ref_malloc(recept_bary, 4 * n_recept, REF_DBL);
  ref_malloc(recept_cell, n_recept, REF_INT);
  ref_malloc(recept_global, n_recept, REF_GLOB);
  ref_malloc(recept_ret, n_recept, REF_INT);
  ref_malloc(recept_part, n_recept, REF_INT);

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node) && REF_EMPTY != ref_interp->cell[node]) {
      for (i = 0; i < 4; i++) {
        recept_bary[i + 4 * n_recept] = ref_interp->bary[i + 4 * node];
      }
      recept_cell[n_recept] = ref_interp->cell[node];
      recept_global[n_recept] = ref_node_global(to_node, node);
      recept_part[n_recept] = ref_interp->part[node];
      recept_ret[n_recept] = to_part[node];
      n_recept++;
    }
  }

  RSS(ref_mpi_blindsend(ref_mpi, recept_part, (void *)recept_cell, 1, n_recept,
                        (void **)(&donor_cell), &n_donor, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, recept_part, (void *)recept_ret, 1, n_recept,
                        (void **)(&donor_ret), &n_donor, REF_INT_TYPE),
      "blind send ret");
  RSS(ref_mpi_blindsend(ref_mpi, recept_part, (void *)recept_global, 1,
                        n_recept, (void **)(&donor_global), &n_donor,
                        REF_GLOB_TYPE),
      "blind send global");
  RSS(ref_mpi_blindsend(ref_mpi, recept_part, (void *)recept_bary, 4, n_recept,
                        (void **)(&donor_bary), &n_donor, REF_DBL_TYPE),
      "blind send bary");

  ref_malloc_init(donor_nodes, 4 * n_donor, REF_GLOB, REF_EMPTY);
  ref_malloc(donor_donation, n_donor, REF_INT);
  ref_malloc(donor_part, n_donor, REF_INT);
  ref_malloc(donor_origpart, n_donor, REF_INT);

  for (donation = 0; donation < n_donor; donation++) {
    RSS(ref_cell_nodes(from_cell, donor_cell[donation], nodes),
        "node needs to be localized");
    for (i = 0; i < ref_cell_node_per(from_cell); i++) {
      from_part[nodes[i]] = donor_ret[donation];
    }
  }
  RSS(ref_node_ghost_int(from_node, from_part, 1), "ghost from_part");
  if (report_migration_volume)
    RSS(ref_interp_from_part_status(ref_interp, from_part), "from part status");
  RSS(ref_interp_fill_empty_from_part(ref_interp, from_part), "fill part");
  if (report_migration_volume)
    RSS(ref_interp_from_part_status(ref_interp, from_part), "from part status");

  for (donation = 0; donation < n_donor; donation++) {
    RSS(ref_cell_nodes(from_cell, donor_cell[donation], nodes),
        "node needs to be localized");
    for (i = 0; i < ref_cell_node_per(from_cell); i++) {
      donor_nodes[i + 4 * donation] = ref_node_global(from_node, nodes[i]);
    }
    donor_donation[donation] = donation;
    RSS(ref_cell_part_cell_node(from_cell, from_node, donor_cell[donation],
                                &cell_node),
        "part cell_node");
    donor_part[donation] = from_part[nodes[cell_node]];
    donor_origpart[donation] = ref_mpi_rank(ref_mpi);
  }

  /* ensure parts of from_node are set */
  each_ref_node_valid_node(from_node, node) {
    RUS(REF_EMPTY, from_part[node], "from_part not set for node");
  }

  /* set parts of from_node */
  for (node = 0; node < ref_node_max(from_node); node++)
    ref_node_part(from_node, node) = from_part[node];

  /* shuffle from_node */
  RSS(ref_migrate_shufflin(from_grid), "shufflin from grid");

  if (ref_interp_from_cell_freeable(ref_interp)) {
    ref_cell_free(ref_interp_from_tri(ref_interp));
    ref_cell_free(ref_interp_from_tet(ref_interp));
    RSS(ref_shard_extract_tri(from_grid, &ref_interp_from_tri(ref_interp)),
        "shard tri");
    RSS(ref_shard_extract_tet(from_grid, &ref_interp_from_tet(ref_interp)),
        "shard tet");
    if (ref_grid_twod(from_grid)) {
      from_cell = ref_interp_from_tri(ref_interp);
    } else {
      from_cell = ref_interp_from_tet(ref_interp);
    }
  }

  /* use new from part to translate nodes to cell (back and forth) */

  RSS(ref_mpi_blindsend(ref_mpi, donor_part, (void *)donor_nodes, 4, n_donor,
                        (void **)(&find_nodes), &n_find, REF_GLOB_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, donor_part, (void *)donor_donation, 1, n_donor,
                        (void **)(&find_donation), &n_find, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, donor_part, (void *)donor_origpart, 1, n_donor,
                        (void **)(&find_ret), &n_find, REF_INT_TYPE),
      "blind send cell");

  ref_malloc(find_cell, n_find, REF_INT);

  for (find = 0; find < n_find; find++) {
    for (i = 0; i < ref_cell_node_per(from_cell); i++) {
      RSS(ref_node_local(from_node, find_nodes[i + 4 * find], &(nodes[i])),
          "g2l");
    }
    RSS(ref_cell_with(from_cell, nodes, &(find_cell[find])),
        "find cell with nodes");
  }

  RSS(ref_mpi_blindsend(ref_mpi, find_ret, (void *)find_cell, 1, n_find,
                        (void **)(&lookedup_cell), &n_lookedup, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, find_ret, (void *)find_donation, 1, n_find,
                        (void **)(&lookedup_donation), &n_lookedup,
                        REF_INT_TYPE),
      "blind send cell");

  for (lookedup = 0; lookedup < n_lookedup; lookedup++) {
    donor_cell[lookedup_donation[lookedup]] = lookedup_cell[lookedup];
  }

  /* shuffle to */
  for (node = 0; node < ref_node_max(to_node); node++) {
    ref_node_part(to_node, node) = to_part[node];
  }

  RSS(ref_migrate_shufflin(to_grid), "shufflin to grid");

  /* return from data to to grid and refill ref_interp->data */
  RSS(ref_interp_reset(ref_interp), "ref_interp resize/reset");

  ref_free(recept_part);
  ref_free(recept_global);
  ref_free(recept_cell);
  ref_free(recept_bary);

  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_cell, 1, n_donor,
                        (void **)(&recept_cell), &n_recept, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_global, 1, n_donor,
                        (void **)(&recept_global), &n_recept, REF_GLOB_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_part, 1, n_donor,
                        (void **)(&recept_part), &n_recept, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_bary, 4, n_donor,
                        (void **)(&recept_bary), &n_recept, REF_DBL_TYPE),
      "blind send cell");

  for (recept = 0; recept < n_recept; recept++) {
    RSS(ref_node_local(to_node, recept_global[recept], &node), "g2l");
    ref_interp->cell[node] = recept_cell[recept];
    ref_interp->part[node] = recept_part[recept];
    for (i = 0; i < 4; i++) {
      ref_interp->bary[i + 4 * node] = recept_bary[i + 4 * recept];
    }
  }

  /* remake interp search tree */
  RSS(ref_search_free(ref_interp_search(ref_interp)), "free search tree");
  RSS(ref_interp_create_search(ref_interp), "(re)build search tree");

  ref_free(lookedup_donation);
  ref_free(lookedup_cell);

  ref_free(find_cell);
  ref_free(find_ret);
  ref_free(find_donation);
  ref_free(find_nodes);

  ref_free(donor_origpart);
  ref_free(donor_part);
  ref_free(donor_donation);
  ref_free(donor_nodes);
  ref_free(donor_bary);
  ref_free(donor_global);
  ref_free(donor_ret);
  ref_free(donor_cell);

  ref_free(recept_part);
  ref_free(recept_ret);
  ref_free(recept_global);
  ref_free(recept_cell);
  ref_free(recept_bary);

  ref_free(from_part);

  if (report_interp_error) {
    RSS(ref_interp_max_error(ref_interp, &max_error), "max error");
    if (ref_mpi_once(ref_grid_mpi(to_grid))) {
      printf("final %e max error\n", max_error);
    }
  }

  return REF_SUCCESS;
}